

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt
strscan_dec(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex10,int32_t neg,uint32_t dig)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  uint in_ECX;
  StrScanFmt in_EDX;
  double *in_RSI;
  byte *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  uint32_t i_3;
  uint64_t x_1;
  uint32_t cy_1;
  uint32_t i_2;
  uint32_t d_1;
  uint32_t cy;
  uint32_t i_1;
  int32_t idig;
  int32_t ex2;
  uint32_t lo;
  uint32_t hi;
  double n;
  uint64_t x;
  uint8_t *xis;
  uint32_t d;
  uint32_t i;
  uint8_t *xip;
  uint8_t xi [512];
  undefined8 in_stack_fffffffffffffd40;
  double dVar5;
  TValue *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  uint local_2a8;
  uint local_284;
  uint local_274;
  uint local_270;
  uint local_268;
  uint local_264;
  int local_260;
  uint local_258;
  uint local_254;
  double local_250;
  double local_248;
  byte *local_240;
  uint local_234;
  byte *local_230;
  byte local_228 [512];
  int local_28;
  uint local_24;
  uint local_20;
  StrScanFmt local_1c;
  double *local_18;
  byte *local_10;
  StrScanFmt local_4;
  
  local_230 = local_228;
  local_28 = in_R9D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_stack_00000008 == 0) {
    local_24 = 0;
    local_228[0] = 0;
  }
  else {
    local_234 = in_stack_00000008;
    local_24 = in_R8D;
    if (800 < in_stack_00000008) {
      local_24 = (in_stack_00000008 - 800) + in_R8D;
      local_234 = 800;
    }
    if (((local_24 ^ local_234) & 1) != 0) {
      if (*in_RDI == 0x2e) {
        local_10 = in_RDI + 1;
        bVar1 = in_RDI[1];
      }
      else {
        bVar1 = *in_RDI;
      }
      local_228[0] = bVar1 & 0xf;
      local_230 = local_228 + 1;
      local_234 = local_234 - 1;
      local_10 = local_10 + 1;
    }
    for (; 1 < local_234; local_234 = local_234 - 2) {
      if (*local_10 == 0x2e) {
        bVar1 = local_10[1];
        local_10 = local_10 + 1;
      }
      else {
        bVar1 = *local_10;
      }
      pbVar4 = local_10 + 1;
      if (*pbVar4 == 0x2e) {
        bVar2 = local_10[2];
        local_10 = local_10 + 2;
      }
      else {
        bVar2 = *pbVar4;
        local_10 = pbVar4;
      }
      *local_230 = (bVar1 & 0xf) * '\n' + (bVar2 & 0xf);
      local_10 = local_10 + 1;
      local_230 = local_230 + 1;
    }
    if (local_234 != 0) {
      if (*local_10 == 0x2e) {
        bVar1 = local_10[1];
        local_10 = local_10 + 1;
      }
      else {
        bVar1 = *local_10;
      }
      *local_230 = (bVar1 & 0xf) * '\n';
      local_24 = local_24 - 1;
      in_stack_00000008 = in_stack_00000008 + 1;
      local_10 = local_10 + 1;
      local_230 = local_230 + 1;
    }
    if (in_stack_00000008 < 0x321) {
      for (; 0 < (int)local_24 && in_stack_00000008 < 0x13; local_24 = local_24 - 2) {
        *local_230 = 0;
        in_stack_00000008 = in_stack_00000008 + 2;
        local_230 = local_230 + 1;
      }
    }
    else {
      do {
        pbVar4 = local_10;
        if (*local_10 == 0x2e) {
          local_10 = local_10 + 1;
          bVar1 = pbVar4[1];
        }
        else {
          bVar1 = *local_10;
        }
        if (bVar1 != 0x30) {
          local_230[-1] = local_230[-1] | 1;
          break;
        }
        local_10 = local_10 + 1;
        in_stack_00000008 = in_stack_00000008 - 1;
      } while (800 < in_stack_00000008);
      in_stack_00000008 = 800;
    }
  }
  if ((in_stack_00000008 < 0x15) && (local_24 == 0)) {
    local_248 = (double)(ulong)local_228[0];
    local_240 = local_228;
    while (local_240 = local_240 + 1, local_240 < local_230) {
      local_248 = (double)((long)local_248 * 100 + (ulong)*local_240);
    }
    if ((in_stack_00000008 != 0x14) || ((local_228[0] < 0x13 && ((long)local_248 < 0)))) {
      local_2a8 = SUB84(local_248,0);
      if (local_1c == STRSCAN_INT) {
        if (((local_20 & 2) == 0) && ((ulong)local_248 < (ulong)(local_28 + 0x80000000))) {
          if (local_28 != 0) {
            local_2a8 = (local_2a8 ^ 0xffffffff) + 1;
          }
          *(uint *)local_18 = local_2a8;
          return STRSCAN_INT;
        }
        if ((local_20 & 0x10) != 0) goto LAB_0012c030;
        local_1c = STRSCAN_NUM;
      }
      else {
        if (local_1c == STRSCAN_U32) {
LAB_0012c030:
          if ((ulong)local_248 >> 0x20 != 0) {
            return STRSCAN_ERROR;
          }
          if (local_28 != 0) {
            local_2a8 = (local_2a8 ^ 0xffffffff) + 1;
          }
          *(uint *)local_18 = local_2a8;
          return STRSCAN_U32;
        }
        if (local_1c - STRSCAN_I64 < 2) {
          if (local_28 != 0) {
            local_248 = (double)(((ulong)local_248 ^ 0xffffffffffffffff) + 1);
          }
          *local_18 = local_248;
          return local_1c;
        }
      }
      if (-1 < (long)local_248) {
        local_250 = (double)(long)local_248;
        if (local_28 != 0) {
          local_250 = -local_250;
        }
        *local_18 = local_250;
        return local_1c;
      }
    }
  }
  if (local_1c == STRSCAN_INT) {
    if ((local_20 & 0x10) != 0) {
      return STRSCAN_ERROR;
    }
    local_1c = STRSCAN_NUM;
  }
  else if (STRSCAN_INT < local_1c) {
    return STRSCAN_ERROR;
  }
  local_254 = 0;
  local_258 = (int)local_230 - (int)local_228;
  local_260 = local_258 + ((int)local_24 >> 1);
  if (local_260 < 0x9c) {
    if (local_260 < -0xa3) {
      dVar5 = -0.0;
      if (local_28 == 0) {
        dVar5 = 0.0;
      }
      *local_18 = dVar5;
      local_4 = local_1c;
    }
    else {
      while (local_260 < 9 && local_260 < (int)(local_258 - local_254 & 0x1ff)) {
        local_268 = 0;
        local_264 = local_258;
        while( true ) {
          local_264 = local_264 - 1 & 0x1ff;
          uVar3 = (uint)local_228[local_264] * 0x40 + local_268;
          local_268 = uVar3 / 100;
          uVar3 = uVar3 % 100;
          local_228[local_264] = (byte)uVar3;
          if (local_264 == local_254) break;
          if ((uVar3 == 0) && (local_264 == (local_258 - 1 & 0x1ff))) {
            local_258 = local_264;
          }
        }
        if (local_268 != 0) {
          local_254 = local_254 - 1 & 0x1ff;
          if (local_228[local_258 - 1 & 0x1ff] == 0) {
            local_258 = local_258 - 1 & 0x1ff;
          }
          else if (local_254 == local_258) {
            local_258 = local_258 - 1 & 0x1ff;
            uVar3 = local_258 - 1 & 0x1ff;
            local_228[uVar3] = local_228[uVar3] | local_228[local_258];
          }
          local_228[local_254] = (byte)local_268;
          local_260 = local_260 + 1;
        }
      }
LAB_0012c48a:
      if (9 < local_260) {
        local_270 = local_254;
        local_274 = 0;
        do {
          bVar1 = local_228[local_270];
          local_228[local_270] = (byte)(bVar1 + local_274 >> 6);
          local_274 = (bVar1 + local_274 & 0x3f) * 100;
          if ((local_228[local_270] == 0) && (local_270 == local_254)) {
            local_254 = local_254 + 1 & 0x1ff;
            local_260 = local_260 + -1;
          }
          local_270 = local_270 + 1 & 0x1ff;
        } while (local_270 != local_258);
        for (; local_274 != 0; local_274 = (local_274 & 0x3f) * 100) {
          if (local_254 == local_258) {
            uVar3 = local_258 - 1 & 0x1ff;
            local_228[uVar3] = local_228[uVar3] | 1;
            break;
          }
          local_228[local_258] = (byte)(local_274 >> 6);
          local_258 = local_258 + 1 & 0x1ff;
        }
        goto LAB_0012c48a;
      }
      do {
        local_284 = local_254 + 1 & 0x1ff;
        local_260 = local_260 + -1;
        local_254 = local_284;
      } while (0 < local_260 && local_284 != local_258);
      if (local_284 == local_258) {
        do {
          local_260 = local_260 + -1;
        } while (-1 < local_260);
      }
      else {
        do {
          if (local_228[local_284] != 0) break;
          local_284 = local_284 + 1 & 0x1ff;
        } while (local_284 != local_258);
      }
      strscan_double(CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48,(int32_t)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                     (int32_t)in_stack_fffffffffffffd40);
      local_4 = local_1c;
    }
  }
  else {
    if (local_28 == 0) {
      *local_18 = INFINITY;
    }
    else {
      *local_18 = -INFINITY;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

static StrScanFmt strscan_dec(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex10, int32_t neg, uint32_t dig)
{
  uint8_t xi[STRSCAN_DDIG], *xip = xi;

  if (dig) {
    uint32_t i = dig;
    if (i > STRSCAN_MAXDIG) {
      ex10 += (int32_t)(i - STRSCAN_MAXDIG);
      i = STRSCAN_MAXDIG;
    }
    /* Scan unaligned leading digit. */
    if (((ex10^i) & 1))
      *xip++ = ((*p != '.' ? *p : *++p) & 15), i--, p++;
    /* Scan aligned double-digits. */
    for ( ; i > 1; i -= 2) {
      uint32_t d = 10 * ((*p != '.' ? *p : *++p) & 15); p++;
      *xip++ = d + ((*p != '.' ? *p : *++p) & 15); p++;
    }
    /* Scan and realign trailing digit. */
    if (i) *xip++ = 10 * ((*p != '.' ? *p : *++p) & 15), ex10--, dig++, p++;

    /* Summarize rounding-effect of excess digits. */
    if (dig > STRSCAN_MAXDIG) {
      do {
	if ((*p != '.' ? *p : *++p) != '0') { xip[-1] |= 1; break; }
	p++;
      } while (--dig > STRSCAN_MAXDIG);
      dig = STRSCAN_MAXDIG;
    } else {  /* Simplify exponent. */
      while (ex10 > 0 && dig <= 18) *xip++ = 0, ex10 -= 2, dig += 2;
    }
  } else {  /* Only got zeros. */
    ex10 = 0;
    xi[0] = 0;
  }

  /* Fast path for numbers in integer format (but handles e.g. 1e6, too). */
  if (dig <= 20 && ex10 == 0) {
    uint8_t *xis;
    uint64_t x = xi[0];
    double n;
    for (xis = xi+1; xis < xip; xis++) x = x * 100 + *xis;
    if (!(dig == 20 && (xi[0] > 18 || (int64_t)x >= 0))) {  /* No overflow? */
      /* Format-specific handling. */
      switch (fmt) {
      case STRSCAN_INT:
	if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
	  o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	  return STRSCAN_INT;  /* Fast path for 32 bit integers. */
	}
	if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; goto plainnumber; }
	/* fallthrough */
      case STRSCAN_U32:
	if ((x >> 32) != 0) return STRSCAN_ERROR;
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_U32;
      case STRSCAN_I64:
      case STRSCAN_U64:
	o->u64 = neg ? ~x+1u : x;
	return fmt;
      default:
      plainnumber:  /* Fast path for plain numbers < 2^63. */
	if ((int64_t)x < 0) break;
	n = (double)(int64_t)x;
	if (neg) n = -n;
	o->n = n;
	return fmt;
      }
    }
  }

  /* Slow non-integer path. */
  if (fmt == STRSCAN_INT) {
    if ((opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
    fmt = STRSCAN_NUM;
  } else if (fmt > STRSCAN_INT) {
    return STRSCAN_ERROR;
  }
  {
    uint32_t hi = 0, lo = (uint32_t)(xip-xi);
    int32_t ex2 = 0, idig = (int32_t)lo + (ex10 >> 1);

    lj_assertX(lo > 0 && (ex10 & 1) == 0, "bad lo %d ex10 %d", lo, ex10);

    /* Handle simple overflow/underflow. */
    if (idig > 310/2) { if (neg) setminfV(o); else setpinfV(o); return fmt; }
    else if (idig < -326/2) { o->n = neg ? -0.0 : 0.0; return fmt; }

    /* Scale up until we have at least 17 or 18 integer part digits. */
    while (idig < 9 && idig < DLEN(lo, hi)) {
      uint32_t i, cy = 0;
      ex2 -= 6;
      for (i = DPREV(lo); ; i = DPREV(i)) {
	uint32_t d = (xi[i] << 6) + cy;
	cy = (((d >> 2) * 5243) >> 17); d = d - cy * 100;  /* Div/mod 100. */
	xi[i] = (uint8_t)d;
	if (i == hi) break;
	if (d == 0 && i == DPREV(lo)) lo = i;
      }
      if (cy) {
	hi = DPREV(hi);
	if (xi[DPREV(lo)] == 0) lo = DPREV(lo);
	else if (hi == lo) { lo = DPREV(lo); xi[DPREV(lo)] |= xi[lo]; }
	xi[hi] = (uint8_t)cy; idig++;
      }
    }

    /* Scale down until no more than 17 or 18 integer part digits remain. */
    while (idig > 9) {
      uint32_t i = hi, cy = 0;
      ex2 += 6;
      do {
	cy += xi[i];
	xi[i] = (cy >> 6);
	cy = 100 * (cy & 0x3f);
	if (xi[i] == 0 && i == hi) hi = DNEXT(hi), idig--;
	i = DNEXT(i);
      } while (i != lo);
      while (cy) {
	if (hi == lo) { xi[DPREV(lo)] |= 1; break; }
	xi[lo] = (cy >> 6); lo = DNEXT(lo);
	cy = 100 * (cy & 0x3f);
      }
    }

    /* Collect integer part digits and convert to rescaled double. */
    {
      uint64_t x = xi[hi];
      uint32_t i;
      for (i = DNEXT(hi); --idig > 0 && i != lo; i = DNEXT(i))
	x = x * 100 + xi[i];
      if (i == lo) {
	while (--idig >= 0) x = x * 100;
      } else {  /* Gather round bit from remaining digits. */
	x <<= 1; ex2--;
	do {
	  if (xi[i]) { x |= 1; break; }
	  i = DNEXT(i);
	} while (i != lo);
      }
      strscan_double(x, o, ex2, neg);
    }
  }
  return fmt;
}